

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::RelationsAnalyzer::solveDifferent
          (RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  BinaryOperator *in_RDI;
  ConstantInt *newBound;
  int64_t intC;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> boundC;
  V val;
  iterator __end3;
  iterator __begin3;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__range3;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> sample;
  Type shift;
  ConstantInt *c;
  V param;
  BinaryOps opcode;
  ConstantInt **in_stack_ffffffffffffff10;
  pair<llvm::Value_*,_llvm::ConstantInt_*> *in_stack_ffffffffffffff18;
  tuple<const_llvm::Value_*&,_llvm::ConstantInt_*&> *in_stack_ffffffffffffff20;
  
  llvm::BinaryOperator::getOpcode((BinaryOperator *)0x1ceaf9);
  getParams(in_RDI);
  std::tie<llvm::Value_const*,llvm::ConstantInt*>
            (&in_stack_ffffffffffffff18->first,in_stack_ffffffffffffff10);
  std::tuple<llvm::Value_const*&,llvm::ConstantInt*&>::operator=
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return;
}

Assistant:

void RelationsAnalyzer::solveDifferent(ValueRelations &graph,
                                       const llvm::BinaryOperator *op) {
    auto opcode = op->getOpcode();

    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    if (!param)
        return;

    assert(param && c);

    Relations::Type shift;
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        shift = Relations::SLT;
    } else if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
               (opcode == llvm::Instruction::Sub && c->isOne())) {
        shift = Relations::SGT;
    } else
        return;

    if (canShift(graph, param, shift)) {
        graph.set(param, shift, op);

        std::vector<V> sample =
                graph.getDirectlyRelated(param, Relations().set(shift));

        for (V val : sample) {
            assert(graph.are(param, shift, val));
            graph.set(op, Relations::getNonStrict(shift), val);
        }

        auto boundC = graph.getBound(param, Relations::getNonStrict(shift));
        if (boundC.first && boundC.second.has(Relations::getNonStrict(shift)) &&
            !graph.are(op, Relations::getNonStrict(shift), boundC.first)) {
            int64_t intC = boundC.first->getSExtValue();
            intC += shift == Relations::SLT ? 1 : -1;
            const auto *newBound =
                    llvm::ConstantInt::get(boundC.first->getType(), intC, true);
            graph.set(op, Relations::getNonStrict(shift), newBound);
        }
    }
}